

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::StripExtension_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view fname)

{
  allocator<char> local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50 [2];
  allocator<char> local_29;
  size_type local_28;
  size_t lastdot;
  string_view fname_local;
  
  fname_local._M_len = fname._M_len;
  lastdot = (size_t)this;
  fname_local._M_str = (char *)__return_storage_ptr__;
  local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                       ((basic_string_view<char,_std::char_traits<char>_> *)&lastdot,'.',
                        0xffffffffffffffff);
  if (local_28 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&lastdot,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    local_50[0] = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&lastdot,0,local_28
                            );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,local_50,&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripExtension(absl::string_view fname) {
  size_t lastdot = fname.find_last_of('.');
  if (lastdot == std::string::npos) {
    return std::string(fname);
  }
  return std::string(fname.substr(0, lastdot));
}